

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_448ecb::ClosureTypeName::printLeft(ClosureTypeName *this,OutputStream *S)

{
  char *pcVar1;
  size_t sVar2;
  
  OutputStream::grow(S,7);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"\'lambda",7);
  S->CurrentPosition = S->CurrentPosition + 7;
  pcVar1 = (this->Count).First;
  sVar2 = (long)(this->Count).Last - (long)pcVar1;
  if (sVar2 != 0) {
    OutputStream::grow(S,sVar2);
    memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar2);
    S->CurrentPosition = S->CurrentPosition + sVar2;
  }
  OutputStream::grow(S,2);
  pcVar1 = S->Buffer;
  sVar2 = S->CurrentPosition;
  (pcVar1 + sVar2)[0] = '\'';
  (pcVar1 + sVar2)[1] = '(';
  S->CurrentPosition = S->CurrentPosition + 2;
  NodeArray::printWithComma(&this->Params,S);
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "\'lambda";
    S += Count;
    S += "\'(";
    Params.printWithComma(S);
    S += ")";
  }